

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void makewish(boolean magical)

{
  undefined8 obj;
  undefined8 otmp_00;
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *local_2b0;
  int local_28c;
  undefined1 local_288 [3];
  boolean magical_object;
  int tries;
  obj nothing;
  obj *otmp;
  char origbuf [256];
  char buf [256];
  boolean magical_local;
  
  local_28c = 0;
  memcpy(local_288,&zeroobj,0x68);
  if (flags.verbose != '\0') {
    pline("You may wish for an object.");
  }
LAB_0034e2c2:
  do {
    getlin("For what do you wish?",origbuf + 0xf8);
  } while (origbuf[0xf8] == '\x1b');
  strcpy((char *)&otmp,origbuf + 0xf8);
  if ((magical == '\0') && (origbuf[0xf8] == '\0')) {
    iVar2 = rn2(2);
    pcVar3 = ")";
    if (iVar2 != 0) {
      pcVar3 = "%";
    }
    strcpy(origbuf + 0xf8,pcVar3);
  }
  nothing._96_8_ = readobjnam(origbuf + 0xf8,(obj *)local_288,'\x01');
  if ((obj *)nothing._96_8_ == (obj *)0x0) goto code_r0x0034e36a;
  if ((obj *)nothing._96_8_ == (obj *)local_288) {
    historic_event('\0',"refused a wish.");
    return;
  }
  goto LAB_0034e3ef;
code_r0x0034e36a:
  pline("Nothing fitting that description exists in the game.");
  local_28c = local_28c + 1;
  if (4 < local_28c) {
    pline("That\'s enough tries!");
    nothing._96_8_ = readobjnam((char *)0x0,(obj *)0x0,'\x01');
    if ((obj *)nothing._96_8_ == (obj *)0x0) {
      return;
    }
LAB_0034e3ef:
    bVar4 = false;
    if (((nothing._96_8_ != 0) && (bVar4 = true, *(char *)(nothing._96_8_ + 0x37) == '\0')) &&
       (bVar4 = true, *(long *)(nothing._96_8_ + 0x38) == 0)) {
      bVar4 = ((byte)objects[*(short *)(nothing._96_8_ + 0x2a)].field_0x10 >> 4 & 1) != 0;
    }
    if ((magical != '\0') || (!bVar4)) {
      historic_event('\0',"wished for \"%s\".",&otmp);
      if (bVar4) {
        u.uconduct.wishmagic = u.uconduct.wishmagic + 1;
      }
      u.uconduct.wishes = u.uconduct.wishes + 1;
      if ((obj *)nothing._96_8_ != &zeroobj) {
        examine_object((obj *)nothing._96_8_);
        obj = nothing._96_8_;
        if ((u._1052_1_ & 1) == 0) {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
          bVar4 = true;
          if (bVar1 == '\0') {
            bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
            bVar4 = true;
            if ((bVar1 == '\0') && (bVar4 = true, '\x15' < level->locations[u.ux][u.uy].typ)) {
              bVar4 = '!' < level->locations[u.ux][u.uy].typ;
            }
          }
          local_2b0 = "Oops!  %s to the floor!";
          if (bVar4) {
            local_2b0 = "Oops!  %s away from you!";
          }
        }
        else {
          local_2b0 = "Oops!  %s out of your reach!";
        }
        otmp_00 = nothing._96_8_;
        bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
        pcVar3 = "drop";
        if (bVar1 != '\0' || ((byte)u._1052_1_ >> 1 & 1) != 0) {
          pcVar3 = "slip";
        }
        pcVar3 = aobjnam((obj *)otmp_00,pcVar3);
        pcVar3 = The(pcVar3);
        hold_another_object((obj *)obj,local_2b0,pcVar3,(char *)0x0);
      }
      return;
    }
    verbalize("I am sorry, but I am unable to provide you with magical items.");
    if (*(char *)(nothing._96_8_ + 0x37) != '\0') {
      artifact_exists((obj *)nothing._96_8_,
                      (char *)(nothing._96_8_ + 100 + (long)(int)*(short *)(nothing._96_8_ + 0x5a)),
                      '\0');
    }
    obfree((obj *)nothing._96_8_,(obj *)0x0);
    nothing._96_8_ = &zeroobj;
  }
  goto LAB_0034e2c2;
}

Assistant:

void makewish(boolean magical)
{
	char buf[BUFSZ], origbuf[BUFSZ];
	struct obj *otmp, nothing;
	int tries = 0;
	boolean magical_object;

	nothing = zeroobj;  /* lint suppression; only its address matters */
	if (flags.verbose) pline("You may wish for an object.");
 retry:
	do {
	    getlin("For what do you wish?", buf);
	} while (buf[0] == '\033'); /* prevent accidental cancelling of a wish */
	strcpy(origbuf, buf);

	/*
	 *  WORKAROUND: Wishing for a random non-magical item is not easily done
	 *              with the current code.
	 *              For the time being select FOOD or WEAPON class as those
	 *              are the only classes without any magical items in them.
	 */
	if (!magical && buf[0] == 0)
	    strcpy(buf, rn2(2) ? "%" : ")");

	/*
	 *  Note: if they wished for and got a non-object successfully,
	 *  otmp == &zeroobj.  That includes gold, or an artifact that
	 *  has been denied.  Wishing for "nothing" requires a separate
	 *  value to remain distinct.
	 */
	otmp = readobjnam(buf, &nothing, TRUE);
	if (!otmp) {
	    pline("Nothing fitting that description exists in the game.");
	    if (++tries < 5) goto retry;
	    pline("That's enough tries!");
	    otmp = readobjnam(NULL, NULL, TRUE);
	    if (!otmp) return;	/* for safety; should never happen */
	} else if (otmp == &nothing) {
	    historic_event(FALSE, "refused a wish.");
	    /* explicitly wished for "nothing", presumeably attempting
	       to retain wishless conduct */
	    return;
	}

	/* Check if wishing for magical objects is allowed. */
	magical_object = otmp && (otmp->oartifact || otmp->oprops ||
				  objects[otmp->otyp].oc_magic);
	if (!magical && magical_object) {
	    verbalize("I am sorry, but I am unable to provide you with magical items.");
	    if (otmp->oartifact) artifact_exists(otmp, ONAME(otmp), FALSE);
	    obfree(otmp, NULL);
	    otmp = &zeroobj;
	    goto retry;
	} else {
	    historic_event(FALSE, "wished for \"%s\".", origbuf);
	}

	if (magical_object)
	    u.uconduct.wishmagic++;

	/* KMH, conduct */
	u.uconduct.wishes++;

	if (otmp != &zeroobj) {
	    examine_object(otmp);
	    /* The(aobjnam()) is safe since otmp is unidentified -dlc */
	    hold_another_object(otmp, u.uswallow ?
				       "Oops!  %s out of your reach!" :
				       (Is_airlevel(&u.uz) ||
					Is_waterlevel(&u.uz) ||
					level->locations[u.ux][u.uy].typ < IRONBARS ||
					level->locations[u.ux][u.uy].typ >= ICE) ?
				       "Oops!  %s away from you!" :
				       "Oops!  %s to the floor!",
				       The(aobjnam(otmp,
					     Is_airlevel(&u.uz) || u.uinwater ?
						   "slip" : "drop")),
				       NULL);
	}
}